

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::update(SimInfo *this)

{
  SimInfo *in_RDI;
  SimInfo *in_stack_00000020;
  SimInfo *in_stack_00000080;
  
  setupSimVariables(in_stack_00000080);
  calcNConstraints(in_RDI);
  calcNdf(in_stack_00000020);
  calcNdfRaw(this);
  calcNdfTrans(in_RDI);
  return;
}

Assistant:

void SimInfo::update() {
    setupSimVariables();
    calcNConstraints();
    calcNdf();
    calcNdfRaw();
    calcNdfTrans();
  }